

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.c
# Opt level: O1

_Bool eckey_from_cbor(eckey_t *eckey,cn_cbor *pKey,cose_errback *perr)

{
  cn_cbor_type cVar1;
  int iVar2;
  size_t sVar3;
  int iVar4;
  cn_cbor *pcVar5;
  cose_error cVar6;
  ulong uVar7;
  byte rgbKey [65];
  uchar local_78;
  undefined1 local_77 [79];
  
  mbedtls_ecp_keypair_init(eckey);
  cVar6 = COSE_ERR_INVALID_PARAMETER;
  pcVar5 = cn_cbor_mapget_int(pKey,1);
  if (pcVar5 == (cn_cbor *)0x0) goto LAB_0019f2df;
  if (((((pcVar5->type == CN_CBOR_UINT) && ((pcVar5->v).bytes == (uint8_t *)0x2)) &&
       (pcVar5 = cn_cbor_mapget_int(pKey,-1), pcVar5 != (cn_cbor *)0x0)) &&
      ((pcVar5->type == CN_CBOR_UINT && (uVar7 = (pcVar5->v).sint - 1, uVar7 < 3)))) &&
     (iVar4 = mbedtls_ecp_group_load(&eckey->grp,(int)uVar7 + MBEDTLS_ECP_DP_SECP256R1), iVar4 == 0)
     ) {
    sVar3 = (eckey->grp).nbits;
    pcVar5 = cn_cbor_mapget_int(pKey,-2);
    if ((pcVar5 != (cn_cbor *)0x0) && (pcVar5->type == CN_CBOR_BYTES)) {
      iVar4 = (int)(sVar3 + 7 >> 3);
      if (pcVar5->length == iVar4) {
        memcpy(local_77,(pcVar5->v).bytes,(long)pcVar5->length);
        pcVar5 = cn_cbor_mapget_int(pKey,-3);
        if (pcVar5 != (cn_cbor *)0x0) {
          cVar1 = pcVar5->type;
          if (cVar1 == CN_CBOR_FALSE) {
            iVar4 = iVar4 + 1;
            local_78 = '\x02';
          }
          else {
            if (cVar1 != CN_CBOR_TRUE) {
              if (cVar1 == CN_CBOR_BYTES) {
                local_78 = '\x04';
                iVar2 = pcVar5->length;
                if (iVar2 == iVar4) {
                  iVar4 = iVar4 * 2 + 1;
                  memcpy(local_77 + iVar2,(pcVar5->v).bytes,(long)iVar2);
                  goto LAB_0019f391;
                }
              }
              goto LAB_0019f2da;
            }
            iVar4 = iVar4 + 1;
            local_78 = '\x03';
          }
LAB_0019f391:
          iVar4 = mbedtls_ecp_point_read_binary(&eckey->grp,&eckey->Q,&local_78,(long)iVar4);
          if (iVar4 == 0) {
            pcVar5 = cn_cbor_mapget_int(pKey,-4);
            if (pcVar5 == (cn_cbor *)0x0) {
              return true;
            }
            if (pcVar5->type == CN_CBOR_BYTES) {
              iVar4 = mbedtls_mpi_read_binary(&eckey->d,(pcVar5->v).bytes,(long)pcVar5->length);
              if (iVar4 == 0) {
                return true;
              }
              cVar6 = COSE_ERR_CRYPTO_FAIL;
              goto LAB_0019f2df;
            }
          }
        }
      }
    }
  }
LAB_0019f2da:
  cVar6 = COSE_ERR_INVALID_PARAMETER;
LAB_0019f2df:
  if (perr != (cose_errback *)0x0) {
    perr->err = cVar6;
  }
  return false;
}

Assistant:

bool eckey_from_cbor(eckey_t * eckey, const cn_cbor * pKey, cose_errback * perr)
{
	byte  rgbKey[MBEDTLS_ECP_MAX_PT_LEN];
	int cbKey;
	int cbGroup;
	const cn_cbor * p;
	mbedtls_ecp_group_id groupId;

	mbedtls_ecp_keypair_init(eckey);

	p = cn_cbor_mapget_int(pKey, COSE_Key_Type);
	CHECK_CONDITION(p != NULL, COSE_ERR_INVALID_PARAMETER);
	if(p->type == CN_CBOR_UINT) {
		CHECK_CONDITION(p->v.uint == COSE_Key_Type_EC2, COSE_ERR_INVALID_PARAMETER);
	}
	else {
		FAIL_CONDITION(COSE_ERR_INVALID_PARAMETER);
	}

	p = cn_cbor_mapget_int(pKey, COSE_Key_EC_Curve);
	CHECK_CONDITION((p != NULL) && (p->type == CN_CBOR_UINT), COSE_ERR_INVALID_PARAMETER);

	switch (p->v.uint) {
	case 1: // P-256
		groupId = MBEDTLS_ECP_DP_SECP256R1;
		break;

	case 2: // P-384
		groupId = MBEDTLS_ECP_DP_SECP384R1;
		break;

	case 3: // P-521
		groupId = MBEDTLS_ECP_DP_SECP521R1;
		break;

	default:
		FAIL_CONDITION(COSE_ERR_INVALID_PARAMETER);
	}
	CHECK_CONDITION(mbedtls_ecp_group_load(&eckey->grp, groupId) == 0, COSE_ERR_INVALID_PARAMETER);
	cbGroup = (eckey->grp.nbits + 7) / 8;

	p = cn_cbor_mapget_int(pKey, COSE_Key_EC_X);
	CHECK_CONDITION((p != NULL) && (p->type == CN_CBOR_BYTES), COSE_ERR_INVALID_PARAMETER);
	CHECK_CONDITION(p->length == cbGroup, COSE_ERR_INVALID_PARAMETER);
	memcpy(rgbKey+1, p->v.str, p->length);

	p = cn_cbor_mapget_int(pKey, COSE_Key_EC_Y);
	CHECK_CONDITION((p != NULL), COSE_ERR_INVALID_PARAMETER);
	if (p->type == CN_CBOR_BYTES) {
		rgbKey[0] = 0x04;
		cbKey = cbGroup * 2 + 1;
		CHECK_CONDITION(p->length == cbGroup, COSE_ERR_INVALID_PARAMETER);
		memcpy(rgbKey + p->length + 1, p->v.str, p->length);
	}
	else if (p->type == CN_CBOR_TRUE) {
		cbKey = cbGroup + 1;
		rgbKey[0] = 0x03;
	}
	else if (p->type == CN_CBOR_FALSE) {
		cbKey = cbGroup + 1;
		rgbKey[0] = 0x02;
	}
	else FAIL_CONDITION(COSE_ERR_INVALID_PARAMETER);

	CHECK_CONDITION(mbedtls_ecp_point_read_binary(&eckey->grp, &eckey->Q, rgbKey, cbKey) == 0, COSE_ERR_INVALID_PARAMETER);

	p = cn_cbor_mapget_int(pKey, COSE_Key_EC_d);
	if (p != NULL) {
		CHECK_CONDITION(p->type == CN_CBOR_BYTES, COSE_ERR_INVALID_PARAMETER);
		CHECK_CONDITION(mbedtls_mpi_read_binary( &eckey->d, p->v.bytes, p->length) == 0, COSE_ERR_CRYPTO_FAIL);
	}
	return true;

errorReturn:
	return false;
}